

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# selftest-x25519.c
# Opt level: O1

int main(void)

{
  long lVar1;
  char *__format;
  anon_struct_96_3_03d04083 *paVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint8_t check [32];
  uint8_t local_48;
  uint8_t uStack_47;
  uint8_t uStack_46;
  uint8_t uStack_45;
  uint8_t uStack_44;
  uint8_t uStack_43;
  uint8_t uStack_42;
  uint8_t uStack_41;
  uint8_t uStack_40;
  uint8_t uStack_3f;
  uint8_t uStack_3e;
  uint8_t uStack_3d;
  uint8_t uStack_3c;
  uint8_t uStack_3b;
  uint8_t uStack_3a;
  uint8_t uStack_39;
  uint8_t local_38;
  uint8_t uStack_37;
  uint8_t uStack_36;
  uint8_t uStack_35;
  uint8_t uStack_34;
  uint8_t uStack_33;
  uint8_t uStack_32;
  uint8_t uStack_31;
  uint8_t uStack_30;
  uint8_t uStack_2f;
  uint8_t uStack_2e;
  uint8_t uStack_2d;
  uint8_t uStack_2c;
  uint8_t uStack_2b;
  uint8_t uStack_2a;
  uint8_t uStack_29;
  
  paVar2 = table;
  lVar1 = 0;
  __format = "dh-selftest: test number %d failed\n";
  do {
    x25519(&local_48,paVar2->scalar,paVar2->point);
    auVar5[0] = -(paVar2->result[0x10] == local_38);
    auVar5[1] = -(paVar2->result[0x11] == uStack_37);
    auVar5[2] = -(paVar2->result[0x12] == uStack_36);
    auVar5[3] = -(paVar2->result[0x13] == uStack_35);
    auVar5[4] = -(paVar2->result[0x14] == uStack_34);
    auVar5[5] = -(paVar2->result[0x15] == uStack_33);
    auVar5[6] = -(paVar2->result[0x16] == uStack_32);
    auVar5[7] = -(paVar2->result[0x17] == uStack_31);
    auVar5[8] = -(paVar2->result[0x18] == uStack_30);
    auVar5[9] = -(paVar2->result[0x19] == uStack_2f);
    auVar5[10] = -(paVar2->result[0x1a] == uStack_2e);
    auVar5[0xb] = -(paVar2->result[0x1b] == uStack_2d);
    auVar5[0xc] = -(paVar2->result[0x1c] == uStack_2c);
    auVar5[0xd] = -(paVar2->result[0x1d] == uStack_2b);
    auVar5[0xe] = -(paVar2->result[0x1e] == uStack_2a);
    auVar5[0xf] = -(paVar2->result[0x1f] == uStack_29);
    auVar3[0] = -(paVar2->result[0] == local_48);
    auVar3[1] = -(paVar2->result[1] == uStack_47);
    auVar3[2] = -(paVar2->result[2] == uStack_46);
    auVar3[3] = -(paVar2->result[3] == uStack_45);
    auVar3[4] = -(paVar2->result[4] == uStack_44);
    auVar3[5] = -(paVar2->result[5] == uStack_43);
    auVar3[6] = -(paVar2->result[6] == uStack_42);
    auVar3[7] = -(paVar2->result[7] == uStack_41);
    auVar3[8] = -(paVar2->result[8] == uStack_40);
    auVar3[9] = -(paVar2->result[9] == uStack_3f);
    auVar3[10] = -(paVar2->result[10] == uStack_3e);
    auVar3[0xb] = -(paVar2->result[0xb] == uStack_3d);
    auVar3[0xc] = -(paVar2->result[0xc] == uStack_3c);
    auVar3[0xd] = -(paVar2->result[0xd] == uStack_3b);
    auVar3[0xe] = -(paVar2->result[0xe] == uStack_3a);
    auVar3[0xf] = -(paVar2->result[0xf] == uStack_39);
    auVar3 = auVar3 & auVar5;
    if ((ushort)((ushort)(SUB161(auVar3 >> 7,0) & 1) | (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar3 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar3 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar3 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar3 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar3 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar3 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar3 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar3 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar3 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar3 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar3 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar3 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar3 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar3[0xf] >> 7) << 0xf) != 0xffff) goto LAB_00101215;
    lVar1 = lVar1 + 1;
    paVar2 = paVar2 + 1;
  } while (lVar1 != 0x400);
  paVar2 = table;
  lVar1 = 0;
  __format = "dh-selftest: (OLD API) test number %d failed\n";
  while( true ) {
    DH(&local_48,paVar2->scalar,paVar2->point);
    auVar6[0] = -(paVar2->result[0x10] == local_38);
    auVar6[1] = -(paVar2->result[0x11] == uStack_37);
    auVar6[2] = -(paVar2->result[0x12] == uStack_36);
    auVar6[3] = -(paVar2->result[0x13] == uStack_35);
    auVar6[4] = -(paVar2->result[0x14] == uStack_34);
    auVar6[5] = -(paVar2->result[0x15] == uStack_33);
    auVar6[6] = -(paVar2->result[0x16] == uStack_32);
    auVar6[7] = -(paVar2->result[0x17] == uStack_31);
    auVar6[8] = -(paVar2->result[0x18] == uStack_30);
    auVar6[9] = -(paVar2->result[0x19] == uStack_2f);
    auVar6[10] = -(paVar2->result[0x1a] == uStack_2e);
    auVar6[0xb] = -(paVar2->result[0x1b] == uStack_2d);
    auVar6[0xc] = -(paVar2->result[0x1c] == uStack_2c);
    auVar6[0xd] = -(paVar2->result[0x1d] == uStack_2b);
    auVar6[0xe] = -(paVar2->result[0x1e] == uStack_2a);
    auVar6[0xf] = -(paVar2->result[0x1f] == uStack_29);
    auVar4[0] = -(paVar2->result[0] == local_48);
    auVar4[1] = -(paVar2->result[1] == uStack_47);
    auVar4[2] = -(paVar2->result[2] == uStack_46);
    auVar4[3] = -(paVar2->result[3] == uStack_45);
    auVar4[4] = -(paVar2->result[4] == uStack_44);
    auVar4[5] = -(paVar2->result[5] == uStack_43);
    auVar4[6] = -(paVar2->result[6] == uStack_42);
    auVar4[7] = -(paVar2->result[7] == uStack_41);
    auVar4[8] = -(paVar2->result[8] == uStack_40);
    auVar4[9] = -(paVar2->result[9] == uStack_3f);
    auVar4[10] = -(paVar2->result[10] == uStack_3e);
    auVar4[0xb] = -(paVar2->result[0xb] == uStack_3d);
    auVar4[0xc] = -(paVar2->result[0xc] == uStack_3c);
    auVar4[0xd] = -(paVar2->result[0xd] == uStack_3b);
    auVar4[0xe] = -(paVar2->result[0xe] == uStack_3a);
    auVar4[0xf] = -(paVar2->result[0xf] == uStack_39);
    auVar4 = auVar4 & auVar6;
    if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) | (ushort)(SUB161(auVar4 >> 0xf,0) & 1) << 1 |
                 (ushort)(SUB161(auVar4 >> 0x17,0) & 1) << 2 |
                 (ushort)(SUB161(auVar4 >> 0x1f,0) & 1) << 3 |
                 (ushort)(SUB161(auVar4 >> 0x27,0) & 1) << 4 |
                 (ushort)(SUB161(auVar4 >> 0x2f,0) & 1) << 5 |
                 (ushort)(SUB161(auVar4 >> 0x37,0) & 1) << 6 |
                 (ushort)(SUB161(auVar4 >> 0x3f,0) & 1) << 7 |
                 (ushort)(SUB161(auVar4 >> 0x47,0) & 1) << 8 |
                 (ushort)(SUB161(auVar4 >> 0x4f,0) & 1) << 9 |
                 (ushort)(SUB161(auVar4 >> 0x57,0) & 1) << 10 |
                 (ushort)(SUB161(auVar4 >> 0x5f,0) & 1) << 0xb |
                 (ushort)(SUB161(auVar4 >> 0x67,0) & 1) << 0xc |
                 (ushort)(SUB161(auVar4 >> 0x6f,0) & 1) << 0xd |
                 (ushort)(SUB161(auVar4 >> 0x77,0) & 1) << 0xe |
                (ushort)(byte)(auVar4[0xf] >> 7) << 0xf) != 0xffff) break;
    lVar1 = lVar1 + 1;
    paVar2 = paVar2 + 1;
    if (lVar1 == 0x400) {
      return 0;
    }
  }
LAB_00101215:
  fprintf(_stderr,__format,(ulong)((int)lVar1 + 1));
  return 1;
}

Assistant:

int
main()
{
	uint8_t check[X25519_KEY_LEN];
	int i;

	/*
	 * run x25519 tests against table
	 */
	for (i = 0; i < table_num; i++) {
		x25519(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: test number %d failed\n", i+1);
			return 1;
		}
	}


	/*
	 * test old interface
	 */
	for (i = 0; i < table_num; i++) {
		DH(check, table[i].scalar, table[i].point);
		if (memcmp(check, table[i].result, X25519_KEY_LEN) != 0) {
			fprintf(stderr, "dh-selftest: (OLD API) test number %d failed\n", i+1);
			return 1;
		}
	}

	return 0;
}